

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O3

bool kj::tryCopyDirectoryEntry
               (Directory *to,PathPtr toPath,WriteMode toMode,ReadableDirectory *from,
               PathPtr fromPath,Type type,bool atomic)

{
  Replacer<kj::File> *pRVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Replacer<kj::File> *pRVar3;
  size_t sVar4;
  String *pSVar5;
  char *ptrCopy;
  undefined1 uVar6;
  Own<kj::Directory::Replacer<kj::File>_> replacer;
  undefined8 *local_58;
  char local_50 [8];
  Replacer<kj::File> *local_48;
  long local_40;
  undefined8 *local_38;
  
  sVar4 = toPath.parts.size_;
  pSVar5 = toPath.parts.ptr;
  if (type == SYMLINK) {
    (*(from->super_FsNode)._vptr_FsNode[0xc])(local_50,from,fromPath.parts.ptr,fromPath.parts.size_)
    ;
    replacer.disposer._0_1_ = local_50[0];
    if (local_50[0] == '\x01') {
      replacer.ptr = local_48;
      pRVar3 = (Replacer<kj::File> *)0x2781dd;
      if (local_40 != 0) {
        pRVar3 = local_48;
      }
      iVar2 = (*(to->super_ReadableDirectory).super_FsNode._vptr_FsNode[0x13])
                        (to,pSVar5,sVar4,pRVar3,local_40 + (ulong)(local_40 == 0),(ulong)toMode);
      if (local_48 == (Replacer<kj::File> *)0x0) {
        return (bool)(char)iVar2;
      }
      replacer.ptr = (Replacer<kj::File> *)0x0;
      (**(code **)*local_38)(local_38,local_48,1,local_40,local_40,0);
      return (bool)(char)iVar2;
    }
LAB_00240360:
    uVar6 = 0;
  }
  else {
    if (type == DIRECTORY) {
      (*(from->super_FsNode)._vptr_FsNode[0xb])
                (&replacer,from,fromPath.parts.ptr,fromPath.parts.size_);
      pRVar3 = replacer.ptr;
      if (replacer.ptr == (Replacer<kj::File> *)0x0) goto LAB_00240360;
      local_58 = (undefined8 *)CONCAT71(replacer.disposer._1_7_,(char)replacer.disposer);
      if (atomic) {
        (*(to->super_ReadableDirectory).super_FsNode._vptr_FsNode[0x12])
                  (&replacer,to,pSVar5,sVar4,(ulong)toMode);
        iVar2 = (**(replacer.ptr)->_vptr_Replacer)();
        copyContents((Directory *)CONCAT44(extraout_var_00,iVar2),(ReadableDirectory *)pRVar3);
        iVar2 = (*(replacer.ptr)->_vptr_Replacer[1])();
        pRVar1 = replacer.ptr;
        uVar6 = (undefined1)iVar2;
        if (replacer.ptr != (Replacer<kj::File> *)0x0) {
          replacer.ptr = (Replacer<kj::File> *)0x0;
          (*(code *)**(undefined8 **)CONCAT71(replacer.disposer._1_7_,(char)replacer.disposer))
                    ((undefined8 *)CONCAT71(replacer.disposer._1_7_,(char)replacer.disposer),
                     (_func_int *)((long)&pRVar1->_vptr_Replacer + (long)pRVar1->_vptr_Replacer[-2])
                    );
        }
      }
      else {
        (*(to->super_ReadableDirectory).super_FsNode._vptr_FsNode[0x11])
                  (&replacer,to,pSVar5,sVar4,(ulong)toMode);
        pRVar1 = replacer.ptr;
        if (replacer.ptr == (Replacer<kj::File> *)0x0) goto LAB_00240449;
        copyContents((Directory *)replacer.ptr,(ReadableDirectory *)pRVar3);
        uVar6 = 1;
        (*(code *)**(undefined8 **)CONCAT71(replacer.disposer._1_7_,(char)replacer.disposer))
                  ((undefined8 *)CONCAT71(replacer.disposer._1_7_,(char)replacer.disposer),
                   (_func_int *)((long)&pRVar1->_vptr_Replacer + (long)pRVar1->_vptr_Replacer[-2]));
      }
    }
    else {
      if (type != FILE) {
        _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[47],kj::PathPtr&>
                  ((Fault *)&replacer,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                   ,700,FAILED,(char *)0x0,
                   "\"can only copy files, directories, and symlinks\", fromPath",
                   (char (*) [47])"can only copy files, directories, and symlinks",&fromPath);
        _::Debug::Fault::~Fault((Fault *)&replacer);
        return false;
      }
      (*(from->super_FsNode)._vptr_FsNode[10])
                (&replacer,from,fromPath.parts.ptr,fromPath.parts.size_);
      pRVar3 = replacer.ptr;
      if (replacer.ptr == (Replacer<kj::File> *)0x0) goto LAB_00240360;
      local_58 = (undefined8 *)CONCAT71(replacer.disposer._1_7_,(char)replacer.disposer);
      if (atomic) {
        (*(to->super_ReadableDirectory).super_FsNode._vptr_FsNode[0xe])
                  (&replacer,to,pSVar5,sVar4,(ulong)toMode);
        iVar2 = (**(replacer.ptr)->_vptr_Replacer)();
        (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x68))
                  ((long *)CONCAT44(extraout_var,iVar2),0,pRVar3,0,0xffffffffffffffff);
        iVar2 = (*(replacer.ptr)->_vptr_Replacer[1])();
        pRVar1 = replacer.ptr;
        uVar6 = (undefined1)iVar2;
        if (replacer.ptr != (Replacer<kj::File> *)0x0) {
          replacer.ptr = (Replacer<kj::File> *)0x0;
          (*(code *)**(undefined8 **)CONCAT71(replacer.disposer._1_7_,(char)replacer.disposer))
                    ((undefined8 *)CONCAT71(replacer.disposer._1_7_,(char)replacer.disposer),
                     (_func_int *)((long)&pRVar1->_vptr_Replacer + (long)pRVar1->_vptr_Replacer[-2])
                    );
        }
      }
      else {
        (*(to->super_ReadableDirectory).super_FsNode._vptr_FsNode[0xd])
                  (&replacer,to,pSVar5,sVar4,(ulong)toMode);
        pRVar1 = replacer.ptr;
        if (replacer.ptr == (Replacer<kj::File> *)0x0) {
LAB_00240449:
          uVar6 = 0;
        }
        else {
          (*(replacer.ptr)->_vptr_Replacer[0xd])(replacer.ptr,0,pRVar3,0,0xffffffffffffffff);
          uVar6 = 1;
          (*(code *)**(undefined8 **)CONCAT71(replacer.disposer._1_7_,(char)replacer.disposer))
                    ((undefined8 *)CONCAT71(replacer.disposer._1_7_,(char)replacer.disposer),
                     (_func_int *)((long)&pRVar1->_vptr_Replacer + (long)pRVar1->_vptr_Replacer[-2])
                    );
        }
      }
    }
    (**(code **)*local_58)
              (local_58,(_func_int *)
                        ((long)&pRVar3->_vptr_Replacer + (long)pRVar3->_vptr_Replacer[-2]));
  }
  return (bool)uVar6;
}

Assistant:

static bool tryCopyDirectoryEntry(const Directory& to, PathPtr toPath, WriteMode toMode,
                                  const ReadableDirectory& from, PathPtr fromPath,
                                  FsNode::Type type, bool atomic) {
  // TODO(cleanup): Make this reusable?

  switch (type) {
    case FsNode::Type::FILE: {
      KJ_IF_MAYBE(fromFile, from.tryOpenFile(fromPath)) {
        if (atomic) {
          auto replacer = to.replaceFile(toPath, toMode);
          replacer->get().copy(0, **fromFile, 0, kj::maxValue);
          return replacer->tryCommit();
        } else KJ_IF_MAYBE(toFile, to.tryOpenFile(toPath, toMode)) {
          toFile->get()->copy(0, **fromFile, 0, kj::maxValue);
          return true;
        } else {
          return false;
        }
      } else {
        // Apparently disappeared. Treat as source-doesn't-exist.
        return false;
      }
    }
    case FsNode::Type::DIRECTORY:
      KJ_IF_MAYBE(fromSubdir, from.tryOpenSubdir(fromPath)) {
        if (atomic) {
          auto replacer = to.replaceSubdir(toPath, toMode);
          copyContents(replacer->get(), **fromSubdir);
          return replacer->tryCommit();
        } else KJ_IF_MAYBE(toSubdir, to.tryOpenSubdir(toPath, toMode)) {
          copyContents(**toSubdir, **fromSubdir);
          return true;
        } else {
          return false;
        }
      } else {
        // Apparently disappeared. Treat as source-doesn't-exist.
        return false;
      }
    case FsNode::Type::SYMLINK:
      KJ_IF_MAYBE(content, from.tryReadlink(fromPath)) {
        return to.trySymlink(toPath, *content, toMode);
      } else {
        // Apparently disappeared. Treat as source-doesn't-exist.
        return false;
      }
      break;

    default:
      // Note: Unclear whether it's better to throw an error here or just ignore it / log a
      //   warning. Can reconsider when we see an actual use case.
      KJ_FAIL_REQUIRE("can only copy files, directories, and symlinks", fromPath) {
        return false;
      }
  }
}